

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SchemaValidator::checkTypesOK
          (SchemaValidator *this,SchemaElementDecl *derivedElemDecl,SchemaElementDecl *baseElemDecl,
          XMLCh *derivedElemName)

{
  ModelTypes MVar1;
  ModelTypes MVar2;
  uint uVar3;
  int iVar4;
  ComplexTypeInfo *pCVar5;
  RuntimeException *pRVar6;
  DatatypeValidator *pDVar7;
  DatatypeValidator *pDVar8;
  DatatypeValidator *bDV;
  ComplexTypeInfo *bInfo;
  ComplexTypeInfo *rInfo;
  ModelTypes baseType;
  XMLCh *derivedElemName_local;
  SchemaElementDecl *baseElemDecl_local;
  SchemaElementDecl *derivedElemDecl_local;
  SchemaValidator *this_local;
  
  MVar1 = SchemaElementDecl::getModelType(baseElemDecl);
  if (MVar1 != Any) {
    bInfo = SchemaElementDecl::getComplexTypeInfo(derivedElemDecl);
    pCVar5 = SchemaElementDecl::getComplexTypeInfo(baseElemDecl);
    MVar2 = SchemaElementDecl::getModelType(derivedElemDecl);
    if (MVar2 == Simple) {
      if (MVar1 != Simple) {
        pRVar6 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (pRVar6,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/SchemaValidator.cpp"
                   ,0x67e,PD_NameTypeOK5,derivedElemName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   this->fMemoryManager);
        __cxa_throw(pRVar6,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
      if (bInfo == (ComplexTypeInfo *)0x0) {
        pDVar7 = SchemaElementDecl::getDatatypeValidator(baseElemDecl);
        if ((pCVar5 == (ComplexTypeInfo *)0x0) && (pDVar7 != (DatatypeValidator *)0x0)) {
          pDVar8 = SchemaElementDecl::getDatatypeValidator(derivedElemDecl);
          uVar3 = (*(pDVar7->super_XSerializable)._vptr_XSerializable[9])(pDVar7,pDVar8);
          if ((uVar3 & 1) != 0) {
            return;
          }
        }
        pRVar6 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (pRVar6,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/SchemaValidator.cpp"
                   ,0x687,PD_NameTypeOK5,derivedElemName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   this->fMemoryManager);
        __cxa_throw(pRVar6,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
    }
    if (bInfo != pCVar5) {
      for (; bInfo != (ComplexTypeInfo *)0x0 && bInfo != pCVar5;
          bInfo = ComplexTypeInfo::getBaseComplexTypeInfo(bInfo)) {
        iVar4 = ComplexTypeInfo::getDerivedBy(bInfo);
        if (iVar4 != 4) {
          bInfo = (ComplexTypeInfo *)0x0;
          break;
        }
      }
      if (bInfo == (ComplexTypeInfo *)0x0) {
        pRVar6 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (pRVar6,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/SchemaValidator.cpp"
                   ,0x69a,PD_NameTypeOK5,derivedElemName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   this->fMemoryManager);
        __cxa_throw(pRVar6,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
      }
    }
  }
  return;
}

Assistant:

void
SchemaValidator::checkTypesOK(const SchemaElementDecl* const derivedElemDecl,
                              const SchemaElementDecl* const baseElemDecl,
                              const XMLCh* const derivedElemName) {

    SchemaElementDecl::ModelTypes baseType = baseElemDecl->getModelType();

    if (baseType == SchemaElementDecl::Any) {
        return;
    }

    ComplexTypeInfo* rInfo = derivedElemDecl->getComplexTypeInfo();
    ComplexTypeInfo* bInfo = baseElemDecl->getComplexTypeInfo();

    if (derivedElemDecl->getModelType() == SchemaElementDecl::Simple) {

        if (baseType != SchemaElementDecl::Simple) {
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::PD_NameTypeOK5, derivedElemName, fMemoryManager);
        }

        if (!rInfo) {

            DatatypeValidator* bDV = baseElemDecl->getDatatypeValidator();

            if (bInfo || bDV == 0 ||
				!bDV->isSubstitutableBy(derivedElemDecl->getDatatypeValidator())) {
                ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::PD_NameTypeOK5, derivedElemName, fMemoryManager);
            }

            return;
        }
    }

    if (rInfo == bInfo)
        return;

    for (; rInfo && rInfo != bInfo; rInfo = rInfo->getBaseComplexTypeInfo()) {
        if (rInfo->getDerivedBy() != SchemaSymbols::XSD_RESTRICTION) {

            rInfo = 0;
            break;
        }
    }

    if (!rInfo) {
        ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::PD_NameTypeOK5, derivedElemName, fMemoryManager);
    }
}